

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ColorConvertRGBtoHSV(float r,float g,float b,float *out_h,float *out_s,float *out_v)

{
  float *in_RDX;
  float *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float chroma;
  float K;
  float local_38;
  float local_2c;
  float local_c;
  float local_8;
  float local_4;
  
  local_2c = 0.0;
  local_c = in_XMM2_Da;
  local_8 = in_XMM1_Da;
  local_4 = in_XMM0_Da;
  if (in_XMM1_Da < in_XMM2_Da) {
    ImSwap<float>(&local_8,&local_c);
    local_2c = -1.0;
  }
  if (local_4 < local_8) {
    ImSwap<float>(&local_4,&local_8);
    local_2c = -0.33333334 - local_2c;
  }
  if (local_c <= local_8) {
    local_38 = local_c;
  }
  else {
    local_38 = local_8;
  }
  *in_RDI = ABS(local_2c + (local_8 - local_c) / ((local_4 - local_38) * 6.0 + 1e-20));
  *in_RSI = (local_4 - local_38) / (local_4 + 1e-20);
  *in_RDX = local_4;
  return;
}

Assistant:

void ImGui::ColorConvertRGBtoHSV(float r, float g, float b, float& out_h, float& out_s, float& out_v)
{
    float K = 0.f;
    if (g < b)
    {
        ImSwap(g, b);
        K = -1.f;
    }
    if (r < g)
    {
        ImSwap(r, g);
        K = -2.f / 6.f - K;
    }

    const float chroma = r - (g < b ? g : b);
    out_h = ImFabs(K + (g - b) / (6.f * chroma + 1e-20f));
    out_s = chroma / (r + 1e-20f);
    out_v = r;
}